

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

int VP8LGetHistoImageSymbols
              (int xsize,int ysize,VP8LBackwardRefs *refs,int quality,int low_effort,
              int histogram_bits,int cache_bits,VP8LHistogramSet *image_histo,
              VP8LHistogram *tmp_histo,uint32_t *histogram_symbols,WebPPicture *pic,
              int percent_range,int *percent)

{
  HistogramPair *pHVar1;
  HistogramPair *pHVar2;
  HistogramPair *pHVar3;
  ushort uVar4;
  int iVar5;
  VP8LHistogram **ppVVar6;
  VP8LHistogram **ppVVar7;
  VP8LHistogram *pVVar8;
  VP8LHistogram *pVVar9;
  uint32_t *__dest;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  PixOrCopy *pPVar15;
  char cVar16;
  int tmp;
  int iVar17;
  uint uVar18;
  int iVar19;
  VP8LHistogramSet *set;
  int64_t iVar20;
  HistogramPair *pHVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  int64_t iVar29;
  short sVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  byte bVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  int iVar41;
  PixOrCopy *v;
  ulong uVar42;
  long lVar43;
  short sVar44;
  uint16_t uVar45;
  int iVar46;
  ulong uVar47;
  int iVar48;
  bool bVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint64_t bit_cost;
  anon_struct_4_2_be341b0f bin_info [64];
  VP8LHistogram *local_1c0;
  ulong local_1b8;
  HistoQueue local_198;
  uint64_t local_188;
  uint64_t uStack_180;
  uint64_t local_178;
  long local_168;
  ulong local_160;
  VP8LHistogramSet *local_158;
  int local_14c;
  undefined4 local_148;
  int local_144;
  uint64_t local_140;
  VP8LRefsCursor local_138;
  uint64_t uStack_120;
  uint64_t local_118;
  uint64_t uStack_110;
  uint64_t local_108;
  uint64_t uStack_100;
  
  bVar34 = (byte)histogram_bits;
  iVar23 = 1 << (bVar34 & 0x1f);
  iVar23 = ((ysize + iVar23) - 1U >> (bVar34 & 0x1f)) * ((iVar23 + xsize) - 1U >> (bVar34 & 0x1f));
  if (histogram_bits == 0) {
    iVar23 = 1;
  }
  set = VP8LAllocateHistogramSet(iVar23,cache_bits);
  uVar25 = 0x40;
  if (low_effort != 0) {
    uVar25 = 4;
  }
  local_158 = set;
  if (set == (VP8LHistogramSet *)0x0) {
    WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto LAB_001778fc;
  }
  local_168 = CONCAT44(local_168._4_4_,iVar23);
  ppVVar6 = set->histograms;
  local_160 = uVar25;
  VP8LRefsCursorInit(&local_138,refs);
  VP8LHistogramSetClear(set);
  if (local_138.cur_pos != (PixOrCopy *)0x0) {
    iVar46 = 0;
    iVar23 = 0;
    do {
      pPVar15 = local_138.cur_pos;
      HistogramAddSinglePixOrCopy
                (ppVVar6[(int)((iVar46 >> (bVar34 & 0x1f)) +
                              (iVar23 >> (bVar34 & 0x1f)) *
                              (((1 << (bVar34 & 0x1f)) + xsize) - 1U >> (bVar34 & 0x1f)))],
                 local_138.cur_pos,(_func_int_int_int *)0x0,0);
      for (iVar46 = (uint)pPVar15->len + iVar46; xsize <= iVar46; iVar46 = iVar46 - xsize) {
        iVar23 = iVar23 + 1;
      }
      local_138.cur_pos = local_138.cur_pos + 1;
      if (local_138.cur_pos == local_138.last_pos) {
        VP8LRefsCursorNextBlock(&local_138);
      }
    } while (local_138.cur_pos != (PixOrCopy *)0x0);
  }
  ppVVar6 = local_158->histograms;
  ppVVar7 = image_histo->histograms;
  image_histo->size = 0;
  if (0 < local_158->max_size) {
    lVar43 = 0;
    do {
      pVVar8 = ppVVar6[lVar43];
      ComputeHistogramCost(pVVar8);
      if ((((pVVar8->is_used[0] == '\0') && (pVVar8->is_used[1] == '\0')) &&
          (pVVar8->is_used[2] == '\0')) &&
         ((pVVar8->is_used[3] == '\0' && (pVVar8->is_used[4] == '\0')))) {
        ppVVar6[lVar43] = (VP8LHistogram *)0x0;
      }
      else {
        pVVar9 = ppVVar7[image_histo->size];
        iVar23 = pVVar9->palette_code_bits;
        iVar17 = (4 << ((byte)iVar23 & 0x1f)) + 0x1150;
        iVar46 = (1 << ((byte)iVar23 & 0x1f)) + 0x118;
        if (iVar23 < 1) {
          iVar46 = 0x118;
        }
        __dest = pVVar9->literal;
        if (iVar23 < 1) {
          iVar17 = 0x1150;
        }
        memcpy(pVVar9,pVVar8,(long)iVar17);
        pVVar9->literal = __dest;
        memcpy(__dest,pVVar8->literal,(long)iVar46 << 2);
        image_histo->size = image_histo->size + 1;
      }
      lVar43 = lVar43 + 1;
    } while (lVar43 < local_158->max_size);
  }
  uVar31 = image_histo->size;
  uVar18 = (int)local_160 * 2;
  bVar49 = SBORROW4(uVar31,uVar18) == (int)(uVar31 + (int)local_160 * -2) < 0;
  bVar34 = quality < 100 && (uVar31 != uVar18 && bVar49);
  if (quality < 100 && (uVar31 != uVar18 && bVar49)) {
    local_1b8 = 0x10;
    if (quality < 0x5a) {
      local_1b8 = (ulong)((((uint)((int)local_168 < 0x101) * 8 + 8 >> (0x200 < (int)local_168)) >>
                          (0x400 < (int)local_168)) >> (quality < 0x33));
    }
    local_168 = CONCAT71(local_168._1_7_,bVar34);
    ppVVar6 = image_histo->histograms;
    if ((int)uVar31 < 1) {
      uVar27 = 0xffffffffffffffff;
      uVar22 = 0;
      uVar42 = 0xffffffffffffffff;
      uVar33 = 0;
      uVar25 = 0xffffffffffffffff;
      uVar35 = 0;
    }
    else {
      uVar37 = 0;
      uVar35 = 0;
      uVar33 = 0;
      uVar22 = 0;
      uVar27 = 0xffffffffffffffff;
      uVar40 = 0xffffffffffffffff;
      uVar47 = 0xffffffffffffffff;
      do {
        pVVar8 = ppVVar6[uVar37];
        uVar25 = pVVar8->costs[0];
        if (uVar35 <= uVar25) {
          uVar35 = uVar25;
        }
        uVar42 = pVVar8->costs[1];
        if (uVar40 < uVar25) {
          uVar25 = uVar40;
        }
        if (uVar33 <= uVar42) {
          uVar33 = uVar42;
        }
        if (uVar47 < uVar42) {
          uVar42 = uVar47;
        }
        uVar40 = pVVar8->costs[2];
        if (uVar22 <= uVar40) {
          uVar22 = uVar40;
        }
        if (uVar27 < uVar40) {
          uVar40 = uVar27;
        }
        uVar27 = uVar40;
        uVar37 = uVar37 + 1;
        uVar40 = uVar25;
        uVar47 = uVar42;
      } while (uVar31 != uVar37);
    }
    if (0 < (int)uVar31) {
      lVar43 = uVar35 - uVar25;
      auVar51._8_4_ = (int)((ulong)lVar43 >> 0x20);
      auVar51._0_8_ = lVar43;
      auVar51._12_4_ = 0x45300000;
      lVar38 = uVar33 - uVar42;
      auVar52._8_4_ = (int)((ulong)lVar38 >> 0x20);
      auVar52._0_8_ = lVar38;
      auVar52._12_4_ = 0x45300000;
      lVar39 = uVar22 - uVar27;
      auVar53._8_4_ = (int)((ulong)lVar39 >> 0x20);
      auVar53._0_8_ = lVar39;
      auVar53._12_4_ = 0x45300000;
      uVar40 = 0;
      do {
        pVVar8 = ppVVar6[uVar40];
        uVar45 = 0;
        if (uVar35 != uVar25) {
          lVar28 = pVVar8->costs[0] - uVar25;
          auVar54._8_4_ = (int)((ulong)lVar28 >> 0x20);
          auVar54._0_8_ = lVar28;
          auVar54._12_4_ = 0x45300000;
          uVar45 = (uint16_t)
                   (int)((((auVar54._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar28) - 4503599627370496.0)) *
                         3.999999) /
                        ((auVar51._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar43) - 4503599627370496.0)));
        }
        if (low_effort == 0) {
          sVar30 = 0;
          sVar44 = 0;
          if (uVar33 != uVar42) {
            lVar28 = pVVar8->costs[1] - uVar42;
            auVar55._8_4_ = (int)((ulong)lVar28 >> 0x20);
            auVar55._0_8_ = lVar28;
            auVar55._12_4_ = 0x45300000;
            sVar44 = (short)((int)((((auVar55._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)lVar28) - 4503599627370496.0))
                                   * 3.999999) /
                                  ((auVar52._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar38) - 4503599627370496.0)))
                            << 2);
          }
          if (uVar22 != uVar27) {
            lVar28 = pVVar8->costs[2] - uVar27;
            auVar56._8_4_ = (int)((ulong)lVar28 >> 0x20);
            auVar56._0_8_ = lVar28;
            auVar56._12_4_ = 0x45300000;
            sVar30 = (short)(int)((((auVar56._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar28) - 4503599627370496.0))
                                  * 3.999999) /
                                 ((auVar53._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)lVar39) - 4503599627370496.0)));
          }
          uVar45 = sVar44 + uVar45 * 0x10 + sVar30;
        }
        pVVar8->bin_id = uVar45;
        uVar40 = uVar40 + 1;
      } while (uVar31 != uVar40);
    }
    local_1c0 = tmp_histo;
    uVar25 = 0;
    do {
      *(undefined4 *)((long)&local_138.cur_pos + uVar25 * 4) = 0xffff;
      uVar25 = uVar25 + 1;
    } while ((local_160 & 0xffffffff) != uVar25);
    if (0 < (int)uVar31) {
      iVar23 = 0;
      do {
        pVVar8 = ppVVar6[iVar23];
        uVar25 = (ulong)pVVar8->bin_id;
        lVar43 = (long)*(short *)((long)&local_138.cur_pos + uVar25 * 4);
        if (lVar43 == -1) {
          *(short *)((long)&local_138.cur_pos + uVar25 * 4) = (short)iVar23;
LAB_001770ee:
          iVar23 = iVar23 + 1;
        }
        else if (low_effort == 0) {
          lVar39 = pVVar8->bit_cost * local_1b8;
          lVar38 = lVar39 + 0x32;
          if (lVar39 < 0) {
            lVar38 = lVar39 + -0x32;
          }
          lVar39 = SUB168(SEXT816(lVar38) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar38;
          pVVar9 = ppVVar6[lVar43];
          lVar36 = pVVar8->bit_cost + pVVar9->bit_cost;
          lVar26 = (lVar39 >> 6) - (lVar39 >> 0x3f);
          lVar28 = lVar26 + lVar36;
          lVar39 = lVar28;
          if (0x7fffffffffffffff - lVar26 < lVar36) {
            lVar39 = 0x7fffffffffffffff;
          }
          if (lVar38 < 100) {
            lVar28 = lVar39;
          }
          iVar46 = GetCombinedHistogramEntropy
                             (pVVar9,pVVar8,lVar28,&local_140,(uint64_t *)&local_198);
          if (iVar46 == 0) {
            iVar23 = iVar23 + 1;
          }
          else {
            HistogramAdd(pVVar9,pVVar8,local_1c0);
            local_1c0->bit_cost = local_140;
            local_1c0->costs[0] = (uint64_t)local_198.queue;
            local_1c0->costs[1] = local_198._8_8_;
            local_1c0->costs[2] = local_188;
            local_1c0->costs[3] = uStack_180;
            local_1c0->costs[4] = local_178;
            if (local_1c0->trivial_symbol[1] == 0xffff) {
              bVar49 = false;
            }
            else if (local_1c0->trivial_symbol[2] == 0xffff) {
              bVar49 = false;
            }
            else {
              bVar49 = local_1c0->trivial_symbol[3] != 0xffff;
            }
            if (!bVar49) {
              pVVar8 = ppVVar6[iVar23];
              bVar49 = true;
              bVar50 = true;
              if ((pVVar8->trivial_symbol[1] != 0xffff) && (pVVar8->trivial_symbol[2] != 0xffff)) {
                bVar50 = pVVar8->trivial_symbol[3] == 0xffff;
              }
              pVVar8 = ppVVar6[lVar43];
              if ((pVVar8->trivial_symbol[1] != 0xffff) && (pVVar8->trivial_symbol[2] != 0xffff)) {
                bVar49 = pVVar8->trivial_symbol[3] == 0xffff;
              }
              bVar49 = (bool)(bVar49 & bVar50);
            }
            if ((!bVar49) &&
               (uVar4 = *(ushort *)((long)&local_138.cur_pos + uVar25 * 4 + 2), uVar4 < 0x20)) {
              *(ushort *)((long)&local_138.cur_pos + uVar25 * 4 + 2) = uVar4 + 1;
              goto LAB_001770ee;
            }
            pVVar8 = ppVVar6[lVar43];
            ppVVar6[lVar43] = local_1c0;
            iVar46 = image_histo->size;
            image_histo->histograms[iVar23] = image_histo->histograms[(long)iVar46 + -1];
            image_histo->size = iVar46 + -1;
            local_1c0 = pVVar8;
          }
        }
        else {
          HistogramAdd(pVVar8,ppVVar6[lVar43],ppVVar6[lVar43]);
          iVar46 = image_histo->size;
          image_histo->histograms[iVar23] = image_histo->histograms[(long)iVar46 + -1];
          image_histo->size = iVar46 + -1;
        }
      } while (iVar23 < image_histo->size);
    }
    if ((low_effort != 0) && (0 < image_histo->size)) {
      lVar43 = 0;
      do {
        ComputeHistogramCost(ppVVar6[lVar43]);
        lVar43 = lVar43 + 1;
      } while (lVar43 < image_histo->size);
    }
    bVar34 = (byte)local_168;
  }
  if ((low_effort != 0 & bVar34) == 0) {
    iVar23 = quality * quality * quality;
    lVar38 = (long)(iVar23 * 99);
    lVar43 = lVar38 + -500000;
    if (-1 < iVar23) {
      lVar43 = lVar38 + 500000;
    }
    uVar25 = SUB168(SEXT816(lVar43) * SEXT816(0x431bde82d7b634db),8) >> 0x12;
    iVar46 = SUB164(SEXT816(lVar43) * SEXT816(0x431bde82d7b634db),0xc) >> 0x1f;
    iVar17 = (int)uVar25 - iVar46;
    iVar23 = image_histo->size;
    local_160 = CONCAT44(local_160._4_4_,iVar17);
    if (iVar17 < iVar23) {
      ppVVar6 = image_histo->histograms;
      local_198.size = 0;
      local_198.max_size = 9;
      local_198.queue = (HistogramPair *)WebPSafeMalloc(10,0x40);
      local_148 = (undefined4)
                  CONCAT71((int7)((ulong)local_198.queue >> 8),
                           local_198.queue == (HistogramPair *)0x0);
      if (local_198.queue != (HistogramPair *)0x0) {
        local_14c = ((int)uVar25 - iVar46) + 1;
        if (0 < iVar23) {
          local_144 = iVar23 / 2;
          local_1c0 = (VP8LHistogram *)0x1;
          iVar46 = 0;
          iVar17 = 0;
          do {
            iVar32 = image_histo->size;
            if ((iVar32 <= (int)local_160) || (iVar17 = iVar17 + 1, local_144 <= iVar17)) break;
            if (local_198.size == 0) {
              iVar29 = 0;
            }
            else {
              iVar29 = (local_198.queue)->cost_diff;
            }
            if (1 < iVar32) {
              uVar31 = (iVar32 + -1) * iVar32;
              iVar48 = iVar32 / 2;
              iVar41 = 1;
              do {
                uVar18 = (uint)((ulong)((long)local_1c0 * 0xbc8f) / 0x7fffffff);
                local_1c0 = (VP8LHistogram *)
                            (ulong)((int)((long)local_1c0 * 0xbc8f) + (uVar18 << 0x1f | uVar18));
                uVar25 = (ulong)local_1c0 % (ulong)uVar31;
                uVar24 = (uint)(uVar25 % (ulong)(iVar32 - 1));
                uVar18 = (uint)(uVar25 / (iVar32 - 1));
                iVar20 = HistoQueuePush(&local_198,ppVVar6,uVar18,
                                        (uVar24 + 1) - (uint)(uVar24 < uVar18),iVar29);
                if (iVar20 < 0) {
                  if (local_198.size == local_198.max_size) break;
                }
                if (iVar20 < 0) {
                  iVar29 = iVar20;
                }
                iVar32 = image_histo->size;
                if ((iVar32 < 2) || (bVar49 = iVar48 <= iVar41, iVar41 = iVar41 + 1, bVar49)) break;
              } while( true );
            }
            pHVar21 = local_198.queue;
            iVar32 = local_198.size;
            if (local_198.size != 0) {
              iVar17 = (local_198.queue)->idx1;
              iVar41 = (local_198.queue)->idx2;
              local_168 = (long)iVar41;
              HistogramAdd(ppVVar6[local_168],ppVVar6[iVar17],ppVVar6[iVar17]);
              pVVar8 = ppVVar6[iVar17];
              pVVar8->bit_cost = pHVar21->cost_combo;
              lVar43 = 0;
              do {
                pVVar8->costs[lVar43] = pHVar21->costs[lVar43];
                lVar43 = lVar43 + 1;
              } while (lVar43 != 5);
              iVar48 = image_histo->size;
              image_histo->histograms[local_168] = image_histo->histograms[(long)iVar48 + -1];
              image_histo->size = iVar48 + -1;
              if (0 < iVar32) {
                iVar48 = 0;
                do {
                  pHVar1 = pHVar21 + iVar48;
                  iVar19 = pHVar21[iVar48].idx1;
                  iVar5 = pHVar21[iVar48].idx2;
                  if ((iVar19 != iVar41 && iVar19 != iVar17) || (iVar5 != iVar41 && iVar5 != iVar17)
                     ) {
                    if ((iVar19 == iVar41 || iVar19 == iVar17) ||
                        (iVar5 == iVar41 || iVar5 == iVar17)) {
                      if (iVar19 == iVar41) {
                        pHVar1->idx1 = iVar17;
                      }
                      if (iVar5 == iVar41) {
                        pHVar1->idx2 = iVar17;
                      }
                      iVar19 = pHVar1->idx1;
                      if (pHVar1->idx2 < iVar19) {
                        pHVar1->idx1 = pHVar1->idx2;
                        pHVar1->idx2 = iVar19;
                      }
                      iVar19 = HistoQueueUpdatePair
                                         (ppVVar6[pHVar1->idx1],ppVVar6[pHVar1->idx2],0,pHVar1);
                      if (iVar19 == 0) goto LAB_0017769d;
                    }
                    iVar19 = image_histo->size;
                    if (pHVar1->idx1 == iVar19) {
                      pHVar1->idx1 = iVar41;
                    }
                    if (pHVar1->idx2 == iVar19) {
                      pHVar1->idx2 = iVar41;
                    }
                    iVar19 = pHVar1->idx1;
                    if (pHVar1->idx2 < iVar19) {
                      pHVar1->idx1 = pHVar1->idx2;
                      pHVar1->idx2 = iVar19;
                    }
                    if (pHVar1->cost_diff < pHVar21->cost_diff) {
                      local_138.cur_pos = *(PixOrCopy **)pHVar21;
                      local_138.cur_block = (PixOrCopyBlock *)pHVar21->cost_diff;
                      local_138.last_pos = (PixOrCopy *)pHVar21->cost_combo;
                      uStack_120 = pHVar21->costs[0];
                      local_118 = pHVar21->costs[1];
                      uStack_110 = pHVar21->costs[2];
                      local_108 = pHVar21->costs[3];
                      uStack_100 = pHVar21->costs[4];
                      iVar19 = pHVar1->idx1;
                      iVar5 = pHVar1->idx2;
                      iVar29 = pHVar1->cost_diff;
                      uVar10 = pHVar1->cost_combo;
                      uVar11 = pHVar1->costs[0];
                      uVar12 = pHVar1->costs[1];
                      uVar13 = pHVar1->costs[2];
                      uVar14 = pHVar1->costs[4];
                      pHVar21->costs[3] = pHVar1->costs[3];
                      pHVar21->costs[4] = uVar14;
                      pHVar21->costs[1] = uVar12;
                      pHVar21->costs[2] = uVar13;
                      pHVar21->cost_combo = uVar10;
                      pHVar21->costs[0] = uVar11;
                      pHVar21->idx1 = iVar19;
                      pHVar21->idx2 = iVar5;
                      pHVar21->cost_diff = iVar29;
                      pHVar1->costs[3] = local_108;
                      pHVar1->costs[4] = uStack_100;
                      pHVar1->costs[1] = local_118;
                      pHVar1->costs[2] = uStack_110;
                      pHVar1->cost_combo = (uint64_t)local_138.last_pos;
                      pHVar1->costs[0] = uStack_120;
                      *(PixOrCopy **)pHVar1 = local_138.cur_pos;
                      pHVar1->cost_diff = (int64_t)local_138.cur_block;
                    }
                    iVar48 = iVar48 + 1;
                  }
                  else {
LAB_0017769d:
                    pHVar3 = pHVar21 + (long)iVar32 + -1;
                    iVar19 = pHVar3->idx1;
                    iVar5 = pHVar3->idx2;
                    iVar29 = pHVar3->cost_diff;
                    uVar12 = pHVar21[(long)iVar32 + -1].cost_combo;
                    uVar13 = (&pHVar21[(long)iVar32 + -1].cost_combo)[1];
                    uVar10 = pHVar21[(long)iVar32 + -1].costs[1];
                    uVar11 = (pHVar21[(long)iVar32 + -1].costs + 1)[1];
                    uVar14 = (pHVar21[(long)iVar32 + -1].costs + 3)[1];
                    pHVar1->costs[3] = pHVar21[(long)iVar32 + -1].costs[3];
                    pHVar1->costs[4] = uVar14;
                    pHVar1->costs[1] = uVar10;
                    pHVar1->costs[2] = uVar11;
                    pHVar1->cost_combo = uVar12;
                    pHVar1->costs[0] = uVar13;
                    pHVar1->idx1 = iVar19;
                    pHVar1->idx2 = iVar5;
                    pHVar1->cost_diff = iVar29;
                    iVar32 = iVar32 + -1;
                  }
                } while (iVar48 < iVar32);
              }
              local_198.size = iVar32;
              iVar17 = 0;
            }
            iVar46 = iVar46 + 1;
          } while (iVar46 != iVar23);
        }
        uVar25 = (ulong)(local_14c < image_histo->size);
      }
      WebPSafeFree(local_198.queue);
      local_198.size = 0;
      local_198.max_size = 0;
      cVar16 = (char)local_148;
    }
    else {
      uVar25 = 0;
      cVar16 = '\0';
    }
    if (cVar16 == '\0') {
      if ((uVar25 & 1) != 0) goto LAB_0017731d;
      iVar23 = image_histo->size;
      ppVVar6 = image_histo->histograms;
      local_198._8_8_ = (ulong)(uint)(iVar23 * iVar23) << 0x20;
      pHVar21 = (HistogramPair *)WebPSafeMalloc((ulong)(iVar23 * iVar23 + 1),0x40);
      local_198.queue = pHVar21;
      if (pHVar21 == (HistogramPair *)0x0) {
        WebPSafeFree((void *)0x0);
      }
      else {
        if (0 < iVar23) {
          iVar46 = 0;
          do {
            iVar32 = iVar46 + 1;
            iVar17 = iVar32;
            if (iVar32 < iVar23) {
              do {
                HistoQueuePush(&local_198,ppVVar6,iVar46,iVar17,0);
                iVar17 = iVar17 + 1;
              } while (iVar23 != iVar17);
            }
            iVar46 = iVar32;
          } while (iVar32 != iVar23);
        }
        if (0 < local_198.size) {
          do {
            pHVar1 = local_198.queue;
            iVar23 = (local_198.queue)->idx1;
            iVar46 = (local_198.queue)->idx2;
            HistogramAdd(ppVVar6[iVar46],ppVVar6[iVar23],ppVVar6[iVar23]);
            pVVar8 = ppVVar6[iVar23];
            pVVar8->bit_cost = pHVar1->cost_combo;
            lVar43 = 0;
            do {
              pVVar8->costs[lVar43] = pHVar1->costs[lVar43];
              lVar43 = lVar43 + 1;
            } while (lVar43 != 5);
            iVar17 = image_histo->size;
            image_histo->histograms[iVar46] = image_histo->histograms[(long)iVar17 + -1];
            image_histo->size = iVar17 + -1;
            iVar17 = local_198.size;
            if (0 < local_198.size) {
              iVar32 = 0;
              do {
                pHVar3 = pHVar1 + iVar32;
                iVar41 = pHVar1[iVar32].idx1;
                if ((((iVar41 == iVar23) || (iVar48 = pHVar3->idx2, iVar48 == iVar46)) ||
                    (iVar41 == iVar46)) || (iVar48 == iVar23)) {
                  pHVar2 = pHVar1 + (long)iVar17 + -1;
                  iVar41 = pHVar2->idx1;
                  iVar48 = pHVar2->idx2;
                  iVar29 = pHVar2->cost_diff;
                  uVar12 = pHVar1[(long)iVar17 + -1].cost_combo;
                  uVar13 = (&pHVar1[(long)iVar17 + -1].cost_combo)[1];
                  uVar10 = pHVar1[(long)iVar17 + -1].costs[1];
                  uVar11 = (pHVar1[(long)iVar17 + -1].costs + 1)[1];
                  uVar14 = (pHVar1[(long)iVar17 + -1].costs + 3)[1];
                  pHVar3->costs[3] = pHVar1[(long)iVar17 + -1].costs[3];
                  pHVar3->costs[4] = uVar14;
                  pHVar3->costs[1] = uVar10;
                  pHVar3->costs[2] = uVar11;
                  pHVar3->cost_combo = uVar12;
                  pHVar3->costs[0] = uVar13;
                  pHVar3->idx1 = iVar41;
                  pHVar3->idx2 = iVar48;
                  pHVar3->cost_diff = iVar29;
                  iVar17 = iVar17 + -1;
                }
                else {
                  iVar19 = image_histo->size;
                  if (iVar41 == iVar19) {
                    pHVar3->idx1 = iVar46;
                  }
                  if (iVar48 == iVar19) {
                    pHVar3->idx2 = iVar46;
                  }
                  iVar41 = pHVar3->idx1;
                  if (pHVar3->idx2 < iVar41) {
                    pHVar3->idx1 = pHVar3->idx2;
                    pHVar3->idx2 = iVar41;
                  }
                  if (pHVar3->cost_diff < pHVar1->cost_diff) {
                    local_138.cur_pos = *(PixOrCopy **)pHVar1;
                    local_138.cur_block = (PixOrCopyBlock *)pHVar1->cost_diff;
                    local_138.last_pos = (PixOrCopy *)pHVar1->cost_combo;
                    uStack_120 = pHVar1->costs[0];
                    local_118 = pHVar1->costs[1];
                    uStack_110 = pHVar1->costs[2];
                    local_108 = pHVar1->costs[3];
                    uStack_100 = pHVar1->costs[4];
                    iVar41 = pHVar3->idx1;
                    iVar48 = pHVar3->idx2;
                    iVar29 = pHVar3->cost_diff;
                    uVar10 = pHVar3->cost_combo;
                    uVar11 = pHVar3->costs[0];
                    uVar12 = pHVar3->costs[1];
                    uVar13 = pHVar3->costs[2];
                    uVar14 = pHVar3->costs[4];
                    pHVar1->costs[3] = pHVar3->costs[3];
                    pHVar1->costs[4] = uVar14;
                    pHVar1->costs[1] = uVar12;
                    pHVar1->costs[2] = uVar13;
                    pHVar1->cost_combo = uVar10;
                    pHVar1->costs[0] = uVar11;
                    pHVar1->idx1 = iVar41;
                    pHVar1->idx2 = iVar48;
                    pHVar1->cost_diff = iVar29;
                    pHVar3->costs[3] = local_108;
                    pHVar3->costs[4] = uStack_100;
                    pHVar3->costs[1] = local_118;
                    pHVar3->costs[2] = uStack_110;
                    pHVar3->cost_combo = (uint64_t)local_138.last_pos;
                    pHVar3->costs[0] = uStack_120;
                    *(PixOrCopy **)pHVar3 = local_138.cur_pos;
                    pHVar3->cost_diff = (int64_t)local_138.cur_block;
                  }
                  iVar32 = iVar32 + 1;
                }
              } while (iVar32 < iVar17);
            }
            local_198.size = iVar17;
            if (0 < image_histo->size) {
              iVar46 = 0;
              do {
                if (iVar23 != iVar46) {
                  HistoQueuePush(&local_198,image_histo->histograms,iVar23,iVar46,0);
                }
                iVar46 = iVar46 + 1;
              } while (iVar46 < image_histo->size);
            }
          } while (0 < local_198.size);
        }
        WebPSafeFree(local_198.queue);
        if (pHVar21 != (HistogramPair *)0x0) goto LAB_0017731d;
      }
    }
    WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
LAB_0017731d:
    ppVVar6 = local_158->histograms;
    ppVVar7 = image_histo->histograms;
    uVar31 = image_histo->size;
    uVar18 = image_histo->max_size;
    uVar25 = (ulong)uVar18;
    if ((int)uVar31 < 2) {
      if (0 < (int)uVar18) {
        memset(histogram_symbols,0,uVar25 * 4);
      }
    }
    else if (0 < (int)uVar18) {
      uVar42 = 0;
      do {
        if (ppVVar6[uVar42] == (VP8LHistogram *)0x0) {
          histogram_symbols[uVar42] = histogram_symbols[uVar42 - 1];
        }
        else {
          uVar33 = 0;
          lVar43 = 0x7fffffffffffffff;
          uVar22 = 0;
          do {
            pVVar8 = ppVVar7[uVar33];
            lVar38 = pVVar8->bit_cost + lVar43;
            lVar39 = lVar38;
            if (0x7fffffffffffffff - lVar43 < (long)pVVar8->bit_cost) {
              lVar39 = 0x7fffffffffffffff;
            }
            if (lVar43 < 0) {
              lVar39 = lVar38;
            }
            iVar23 = GetCombinedHistogramEntropy
                               (pVVar8,ppVVar6[uVar42],lVar39,(uint64_t *)&local_198,
                                (uint64_t *)&local_138);
            if (iVar23 != 0) {
              lVar43 = (long)local_198.queue - pVVar8->bit_cost;
              uVar22 = uVar33 & 0xffffffff;
            }
            uVar33 = uVar33 + 1;
          } while (uVar31 != uVar33);
          histogram_symbols[uVar42] = (uint32_t)uVar22;
        }
        uVar42 = uVar42 + 1;
      } while (uVar42 != uVar25);
    }
    VP8LHistogramSetClear(image_histo);
    image_histo->size = uVar31;
    if (0 < (int)uVar18) {
      uVar42 = 0;
      do {
        if (ppVVar6[uVar42] != (VP8LHistogram *)0x0) {
          pVVar8 = ppVVar7[(int)histogram_symbols[uVar42]];
          HistogramAdd(ppVVar6[uVar42],pVVar8,pVVar8);
        }
        uVar42 = uVar42 + 1;
      } while (uVar25 != uVar42);
    }
    WebPReportProgress(pic,percent_range + *percent,percent);
  }
LAB_001778fc:
  WebPSafeFree(local_158);
  return (int)(pic->error_code == VP8_ENC_OK);
}

Assistant:

int VP8LGetHistoImageSymbols(int xsize, int ysize,
                             const VP8LBackwardRefs* const refs, int quality,
                             int low_effort, int histogram_bits, int cache_bits,
                             VP8LHistogramSet* const image_histo,
                             VP8LHistogram* const tmp_histo,
                             uint32_t* const histogram_symbols,
                             const WebPPicture* const pic, int percent_range,
                             int* const percent) {
  const int histo_xsize =
      histogram_bits ? VP8LSubSampleSize(xsize, histogram_bits) : 1;
  const int histo_ysize =
      histogram_bits ? VP8LSubSampleSize(ysize, histogram_bits) : 1;
  const int image_histo_raw_size = histo_xsize * histo_ysize;
  VP8LHistogramSet* const orig_histo =
      VP8LAllocateHistogramSet(image_histo_raw_size, cache_bits);
  // Don't attempt linear bin-partition heuristic for
  // histograms of small sizes (as bin_map will be very sparse) and
  // maximum quality q==100 (to preserve the compression gains at that level).
  const int entropy_combine_num_bins = low_effort ? NUM_PARTITIONS : BIN_SIZE;
  int entropy_combine;
  if (orig_histo == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Construct the histograms from backward references.
  HistogramBuild(xsize, histogram_bits, refs, orig_histo);
  HistogramCopyAndAnalyze(orig_histo, image_histo);
  entropy_combine =
      (image_histo->size > entropy_combine_num_bins * 2) && (quality < 100);

  if (entropy_combine) {
    const int32_t combine_cost_factor =
        GetCombineCostFactor(image_histo_raw_size, quality);

    HistogramAnalyzeEntropyBin(image_histo, low_effort);
    // Collapse histograms with similar entropy.
    HistogramCombineEntropyBin(image_histo, tmp_histo, entropy_combine_num_bins,
                               combine_cost_factor, low_effort);
  }

  // Don't combine the histograms using stochastic and greedy heuristics for
  // low-effort compression mode.
  if (!low_effort || !entropy_combine) {
    // cubic ramp between 1 and MAX_HISTO_GREEDY:
    const int threshold_size =
        (int)(1 + DivRound(quality * quality * quality * (MAX_HISTO_GREEDY - 1),
                           100 * 100 * 100));
    int do_greedy;
    if (!HistogramCombineStochastic(image_histo, threshold_size, &do_greedy)) {
      WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto Error;
    }
    if (do_greedy) {
      if (!HistogramCombineGreedy(image_histo)) {
        WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
    }
  }

  // Find the optimal map from original histograms to the final ones.
  HistogramRemap(orig_histo, image_histo, histogram_symbols);

  if (!WebPReportProgress(pic, *percent + percent_range, percent)) {
    goto Error;
  }

 Error:
  VP8LFreeHistogramSet(orig_histo);
  return (pic->error_code == VP8_ENC_OK);
}